

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_mesh_compute_binormals(rf_mesh *mesh)

{
  float tangent_w;
  rf_vec3 tangent;
  rf_vec3 normal;
  rf_int i;
  rf_mesh *mesh_local;
  
  normal.y = 0.0;
  normal.z = 0.0;
  for (; (long)normal._4_8_ < (long)mesh->vertex_count; normal._4_8_ = normal._4_8_ + 1) {
  }
  return;
}

Assistant:

RF_API void rf_mesh_compute_binormals(rf_mesh* mesh)
{
    for (rf_int i = 0; i < mesh->vertex_count; i++)
    {
        rf_vec3 normal = {mesh->normals[i * 3 + 0], mesh->normals[i * 3 + 1], mesh->normals[i * 3 + 2] };
        rf_vec3 tangent = {mesh->tangents[i * 4 + 0], mesh->tangents[i * 4 + 1], mesh->tangents[i * 4 + 2] };
        float tangent_w = mesh->tangents[i * 4 + 3];

        // TODO: Register computed binormal in mesh->binormal?
        // rf_vec3 binormal = rf_vec3_mul(rf_vec3_cross_product(normal, tangent), tangent_w);
    }
}